

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

bool icu_63::number::impl::AffixUtils::containsType
               (UnicodeString *affixPattern,AffixPatternType type,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  UErrorCode *in_R8;
  AffixUtils *this;
  undefined8 uVar4;
  AffixTag AVar5;
  AffixTag local_40;
  
  AVar5 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 == 0) {
LAB_0024c79b:
    bVar2 = false;
  }
  else {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar5.type;
    local_40.state = STATE_BASE;
    do {
      uVar4 = local_40._8_8_;
      this = local_40._0_8_;
      bVar2 = hasNext(&local_40,affixPattern);
      if (!bVar2) goto LAB_0024c79b;
      AVar5._8_8_ = affixPattern;
      AVar5.offset = (int)uVar4;
      AVar5.codePoint = (int)((ulong)uVar4 >> 0x20);
      local_40 = nextToken(this,AVar5,(UnicodeString *)status,in_R8);
      if (U_ZERO_ERROR < *status) goto LAB_0024c79b;
    } while (local_40.type != type);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
AffixUtils::containsType(const UnicodeString &affixPattern, AffixPatternType type, UErrorCode &status) {
    if (affixPattern.length() == 0) {
        return false;
    }
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == type) {
            return true;
        }
    }
    return false;
}